

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O3

matrix_type * __thiscall
Disa::Matrix_Dense<double,0ul,0ul>::operator+=
          (Matrix_Dense<double,0ul,0ul> *this,Matrix_Dense<double,_2UL,_2UL> *matrix)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  source_location *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  unsigned_long __val;
  long *plVar4;
  size_t row;
  ulong uVar5;
  long lVar6;
  size_type *local_1d0;
  size_type local_1c8;
  size_type local_1c0;
  undefined8 uStack_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  plVar4 = *(long **)this;
  if (((plVar4 != *(long **)(this + 8)) && ((long)*(long **)(this + 8) - (long)plVar4 == 0x30)) &&
     (plVar4[1] - *plVar4 == 0x10)) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      Vector_Dense<double,0ul>::operator+=
                ((Vector_Dense<double,0ul> *)((long)plVar4 + lVar6),
                 (Vector_Dense<double,_2UL> *)matrix);
      uVar5 = uVar5 + 1;
      plVar4 = *(long **)this;
      matrix = (Matrix_Dense<double,_2UL,_2UL> *)((long)matrix + 0x10);
      lVar6 = lVar6 + 0x18;
    } while (uVar5 < (ulong)((*(long *)(this + 8) - (long)plVar4 >> 3) * -0x5555555555555555));
    return (matrix_type *)this;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  local_50 = &PTR_s__workspace_llm4binary_github_lic_001842a0;
  console_format_abi_cxx11_(&local_48,(Disa *)0x0,(Log_Level)&local_50,in_RCX);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__cxx11::to_string
            (&local_f0,(*(long *)(this + 8) - *(long *)this >> 3) * -0x5555555555555555);
  std::operator+(&local_d0,"Incompatible matrix dimensions, ",&local_f0);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_d0,",");
  local_1b0._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p == paVar3) {
    local_1b0.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_1b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  }
  else {
    local_1b0.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_1b0._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  plVar4 = *(long **)this;
  if (plVar4 == *(long **)(this + 8)) {
    __val = 0;
  }
  else {
    __val = plVar4[1] - *plVar4 >> 3;
  }
  std::__cxx11::to_string(&local_110,__val);
  std::operator+(&local_b0,&local_1b0,&local_110);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_b0," vs. ");
  local_190._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p == paVar3) {
    local_190.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_190.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  }
  else {
    local_190.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_190._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::to_string(&local_130,2);
  std::operator+(&local_90,&local_190,&local_130);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_90,",");
  local_170._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p == paVar3) {
    local_170.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_170.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  }
  else {
    local_170.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_170._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::to_string(&local_150,2);
  std::operator+(&local_70,&local_170,&local_150);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_70,".");
  local_1d0 = (size_type *)(pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0 == paVar3) {
    local_1c0 = paVar3->_M_allocated_capacity;
    uStack_1b8 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_1d0 = &local_1c0;
  }
  else {
    local_1c0 = paVar3->_M_allocated_capacity;
  }
  local_1c8 = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_1d0,local_1c8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_48);
  exit(1);
}

Assistant:

constexpr matrix_type& operator+=(const Matrix_Dense<_type, _row_other, _col_other>& matrix) {
    ASSERT_DEBUG(size() == matrix.size(), "Incompatible matrix dimensions, " + std::to_string(size_row()) + "," +
                                          std::to_string(size_column()) + " vs. " + std::to_string(matrix.size_row()) +
                                          "," + std::to_string(matrix.size_column()) + ".");
    FOR(row, size_row())(*this)[row] += matrix[row];
    return *this;
  }